

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void funcargs(LexState *ls,expdesc *f)

{
  Token *pTVar1;
  int where;
  FuncState *fs;
  SemInfo SVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  TValue *i_o;
  char *msg;
  Token *pTVar7;
  expdesc args;
  Value local_48;
  int local_40;
  undefined8 local_38;
  
  fs = ls->fs;
  where = ls->linenumber;
  iVar4 = (ls->t).token;
  pTVar1 = &ls->t;
  if (iVar4 == 0x11e) {
    local_48 = *(Value *)&(ls->t).seminfo;
    local_40 = 4;
    local_40 = addk(fs,(TValue *)&local_48,(TValue *)&local_48);
    local_38 = 0xffffffffffffffff;
    local_48.b = 4;
    iVar4 = (ls->lookahead).token;
    ls->lastline = ls->linenumber;
    if (iVar4 == 0x11f) {
      iVar4 = llex(ls,&(ls->t).seminfo);
      (ls->t).token = iVar4;
    }
    else {
      pTVar7 = &ls->lookahead;
      uVar3 = *(undefined4 *)&pTVar7->field_0x4;
      SVar2 = (ls->lookahead).seminfo;
      pTVar1->token = pTVar7->token;
      *(undefined4 *)&pTVar1->field_0x4 = uVar3;
      (ls->t).seminfo = SVar2;
      pTVar7->token = 0x11f;
    }
  }
  else {
    if (iVar4 != 0x7b) {
      if (iVar4 == 0x28) {
        if (where == ls->lastline) {
          ls->lastline = where;
          if ((ls->lookahead).token == 0x11f) {
            iVar4 = llex(ls,&(ls->t).seminfo);
            (ls->t).token = iVar4;
          }
          else {
            pTVar7 = &ls->lookahead;
            uVar3 = *(undefined4 *)&pTVar7->field_0x4;
            SVar2 = (ls->lookahead).seminfo;
            pTVar1->token = pTVar7->token;
            *(undefined4 *)&pTVar1->field_0x4 = uVar3;
            (ls->t).seminfo = SVar2;
            pTVar7->token = 0x11f;
          }
          if (pTVar1->token == 0x29) {
            local_48.p = local_48.p & 0xffffffff00000000;
          }
          else {
            explist1(ls,(expdesc *)&local_48);
            luaK_setreturns(fs,(expdesc *)&local_48,-1);
          }
          check_match(ls,0x29,0x28,where);
          goto LAB_0010ee26;
        }
        msg = "ambiguous syntax (function call x new statement)";
      }
      else {
        msg = "function arguments expected";
      }
      luaX_lexerror(ls,msg,iVar4);
    }
    constructor(ls,(expdesc *)&local_48);
  }
LAB_0010ee26:
  iVar4 = (f->u).s.info;
  uVar5 = 0;
  if (1 < local_48.b - 0xdU) {
    if (local_48.b != 0) {
      luaK_exp2nextreg(fs,(expdesc *)&local_48);
    }
    uVar5 = (fs->freereg - iVar4) * 0x800000;
  }
  iVar6 = luaK_code(fs,iVar4 << 6 | uVar5 | 0x801c,fs->ls->lastline);
  f->t = -1;
  f->f = -1;
  f->k = VCALL;
  (f->u).s.info = iVar6;
  fs->f->lineinfo[(long)fs->pc + -1] = where;
  fs->freereg = iVar4 + 1;
  return;
}

Assistant:

static void funcargs(LexState*ls,expdesc*f){
FuncState*fs=ls->fs;
expdesc args;
int base,nparams;
int line=ls->linenumber;
switch(ls->t.token){
case'(':{
if(line!=ls->lastline)
luaX_syntaxerror(ls,"ambiguous syntax (function call x new statement)");
luaX_next(ls);
if(ls->t.token==')')
args.k=VVOID;
else{
explist1(ls,&args);
luaK_setmultret(fs,&args);
}
check_match(ls,')','(',line);
break;
}
case'{':{
constructor(ls,&args);
break;
}
case TK_STRING:{
codestring(ls,&args,ls->t.seminfo.ts);
luaX_next(ls);
break;
}
default:{
luaX_syntaxerror(ls,"function arguments expected");
return;
}
}
base=f->u.s.info;
if(hasmultret(args.k))
nparams=(-1);
else{
if(args.k!=VVOID)
luaK_exp2nextreg(fs,&args);
nparams=fs->freereg-(base+1);
}
init_exp(f,VCALL,luaK_codeABC(fs,OP_CALL,base,nparams+1,2));
luaK_fixline(fs,line);
fs->freereg=base+1;
}